

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O3

bool __thiscall
google::protobuf::internal::
SplitFieldHasExtraIndirectionStatic<google::protobuf::internal::RepeatedPtrFieldBase>
          (internal *this,FieldDescriptor *field)

{
  ReflectionSchema *this_00;
  bool bVar1;
  uint32_t uVar2;
  Cord **ppCVar3;
  FieldDescriptor *field_00;
  OneofDescriptor *oneof_descriptor;
  Reflection *this_01;
  LogMessageFatal aLStack_48 [16];
  
  bVar1 = SplitFieldHasExtraIndirection((FieldDescriptor *)this);
  if (bVar1) {
    return true;
  }
  this_01 = (Reflection *)&stack0xfffffffffffffff0;
  SplitFieldHasExtraIndirectionStatic<google::protobuf::internal::RepeatedPtrFieldBase>
            ((internal *)this_01);
  this_00 = &this_01->schema_;
  bVar1 = ReflectionSchema::InRealOneof(this_00,field_00);
  if (bVar1) {
    if ((field_00->field_0x1 & 0x10) == 0) {
      oneof_descriptor = (OneofDescriptor *)0x0;
    }
    else {
      oneof_descriptor = (field_00->scope_).containing_oneof;
      if (oneof_descriptor == (OneofDescriptor *)0x0) goto LAB_002841cb;
    }
    uVar2 = Reflection::GetOneofCase(this_01,(Message *)field,oneof_descriptor);
    if (uVar2 != field_00->number_) {
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                (aLStack_48,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/message.h"
                 ,0x659,0x3c,"!schema_.InRealOneof(field) || HasOneofField(message, field)");
      absl::lts_20240722::log_internal::LogMessage::
      CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>
                (aLStack_48,8,"Field = ");
      absl::lts_20240722::log_internal::LogMessage::operator<<
                ((LogMessage *)aLStack_48,(string *)(field_00->all_names_ + 1));
      absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(aLStack_48);
    }
  }
  bVar1 = ReflectionSchema::InRealOneof(this_00,field_00);
  if (!bVar1) {
    ppCVar3 = Reflection::GetRawNonOneof<absl::lts_20240722::Cord*>
                        (this_01,(Message *)field,field_00);
    return SUB81(ppCVar3,0);
  }
  bVar1 = ReflectionSchema::IsSplit(this_00,field_00);
  if (!bVar1) {
    uVar2 = ReflectionSchema::GetFieldOffset(this_00,field_00);
    return (bool)((char)field + (char)uVar2);
  }
  Reflection::GetRaw<absl::lts_20240722::Cord*>();
LAB_002841cb:
  protobuf_assumption_failed
            ("res != nullptr",
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/descriptor.h"
             ,0xa9a);
}

Assistant:

bool SplitFieldHasExtraIndirectionStatic(const FieldDescriptor* field) {
  if (std::is_base_of<RepeatedFieldBase, T>() ||
      std::is_base_of<RepeatedPtrFieldBase, T>()) {
    ABSL_DCHECK(SplitFieldHasExtraIndirection(field));
    return true;
  } else if (std::is_base_of<MessageLite, T>()) {
    ABSL_DCHECK(!SplitFieldHasExtraIndirection(field));
    return false;
  }
  return SplitFieldHasExtraIndirection(field);
}